

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::TanH_x86_avx2::forward_inplace(TanH_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [32];
  void *pvVar7;
  int iVar8;
  undefined1 (*pauVar9) [32];
  int _c;
  int iVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var [60];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  Mat local_78;
  
  iVar10 = bottom_top_blob->c;
  iVar12 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  iVar8 = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar12 < 1) {
      iVar12 = _c;
    }
    if (iVar10 < 1) {
      iVar10 = iVar8;
    }
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar38._16_4_ = 0x3f800000;
    auVar38._20_4_ = 0x3f800000;
    auVar38._24_4_ = 0x3f800000;
    auVar38._28_4_ = 0x3f800000;
    auVar25 = ZEXT3264(auVar38);
    for (; _c != iVar10; _c = _c + 1) {
      auVar25 = ZEXT1664(auVar25._0_16_);
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar9 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar86._8_4_ = 0x3e2aaaaa;
      auVar86._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar86._12_4_ = 0x3e2aaaaa;
      auVar86._16_4_ = 0x3e2aaaaa;
      auVar86._20_4_ = 0x3e2aaaaa;
      auVar86._24_4_ = 0x3e2aaaaa;
      auVar86._28_4_ = 0x3e2aaaaa;
      auVar84._8_4_ = 0x3d2aa9c1;
      auVar84._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar84._12_4_ = 0x3d2aa9c1;
      auVar84._16_4_ = 0x3d2aa9c1;
      auVar84._20_4_ = 0x3d2aa9c1;
      auVar84._24_4_ = 0x3d2aa9c1;
      auVar84._28_4_ = 0x3d2aa9c1;
      auVar82._8_4_ = 0x3c088908;
      auVar82._0_8_ = 0x3c0889083c088908;
      auVar82._12_4_ = 0x3c088908;
      auVar82._16_4_ = 0x3c088908;
      auVar82._20_4_ = 0x3c088908;
      auVar82._24_4_ = 0x3c088908;
      auVar82._28_4_ = 0x3c088908;
      auVar80._8_4_ = 0x3ab743ce;
      auVar80._0_8_ = 0x3ab743ce3ab743ce;
      auVar80._12_4_ = 0x3ab743ce;
      auVar80._16_4_ = 0x3ab743ce;
      auVar80._20_4_ = 0x3ab743ce;
      auVar80._24_4_ = 0x3ab743ce;
      auVar80._28_4_ = 0x3ab743ce;
      auVar78._8_4_ = 0x39506967;
      auVar78._0_8_ = 0x3950696739506967;
      auVar78._12_4_ = 0x39506967;
      auVar78._16_4_ = 0x39506967;
      auVar78._20_4_ = 0x39506967;
      auVar78._24_4_ = 0x39506967;
      auVar78._28_4_ = 0x39506967;
      auVar76._8_4_ = 0xbf317218;
      auVar76._0_8_ = 0xbf317218bf317218;
      auVar76._12_4_ = 0xbf317218;
      auVar76._16_4_ = 0xbf317218;
      auVar76._20_4_ = 0xbf317218;
      auVar76._24_4_ = 0xbf317218;
      auVar76._28_4_ = 0xbf317218;
      auVar74._8_4_ = 0x3f800000;
      auVar74._0_8_ = 0x3f8000003f800000;
      auVar74._12_4_ = 0x3f800000;
      auVar74._16_4_ = 0x3f800000;
      auVar74._20_4_ = 0x3f800000;
      auVar74._24_4_ = 0x3f800000;
      auVar74._28_4_ = 0x3f800000;
      auVar72._8_4_ = 0x3f000000;
      auVar72._0_8_ = 0x3f0000003f000000;
      auVar72._12_4_ = 0x3f000000;
      auVar72._16_4_ = 0x3f000000;
      auVar72._20_4_ = 0x3f000000;
      auVar72._24_4_ = 0x3f000000;
      auVar72._28_4_ = 0x3f000000;
      auVar66._8_4_ = 0x3fb8aa3b;
      auVar66._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar66._12_4_ = 0x3fb8aa3b;
      auVar66._16_4_ = 0x3fb8aa3b;
      auVar66._20_4_ = 0x3fb8aa3b;
      auVar66._24_4_ = 0x3fb8aa3b;
      auVar66._28_4_ = 0x3fb8aa3b;
      auVar63._8_4_ = 0xc2b0c0a5;
      auVar63._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar63._12_4_ = 0xc2b0c0a5;
      auVar63._16_4_ = 0xc2b0c0a5;
      auVar63._20_4_ = 0xc2b0c0a5;
      auVar63._24_4_ = 0xc2b0c0a5;
      auVar63._28_4_ = 0xc2b0c0a5;
      auVar56._8_4_ = 0x42b0c0a5;
      auVar56._0_8_ = 0x42b0c0a542b0c0a5;
      auVar56._12_4_ = 0x42b0c0a5;
      auVar56._16_4_ = 0x42b0c0a5;
      auVar56._20_4_ = 0x42b0c0a5;
      auVar56._24_4_ = 0x42b0c0a5;
      auVar56._28_4_ = 0x42b0c0a5;
      auVar22._8_4_ = 0xc0000000;
      auVar22._0_8_ = 0xc0000000c0000000;
      auVar22._12_4_ = 0xc0000000;
      auVar22._16_4_ = 0xc0000000;
      auVar22._20_4_ = 0xc0000000;
      auVar22._24_4_ = 0xc0000000;
      auVar22._28_4_ = 0xc0000000;
      iVar8 = iVar12;
      while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
        auVar24._0_4_ = *(float *)*pauVar9 * -2.0;
        auVar24._4_4_ = *(float *)(*pauVar9 + 4) * -2.0;
        auVar24._8_4_ = *(float *)(*pauVar9 + 8) * -2.0;
        auVar24._12_4_ = *(float *)(*pauVar9 + 0xc) * -2.0;
        auVar24._16_4_ = *(float *)(*pauVar9 + 0x10) * -2.0;
        auVar24._20_4_ = *(float *)(*pauVar9 + 0x14) * -2.0;
        auVar24._28_36_ = auVar25._28_36_;
        auVar24._24_4_ = *(float *)(*pauVar9 + 0x18) * -2.0;
        auVar33 = vminps_avx(auVar24._0_32_,auVar56);
        auVar1 = vmaxps_avx(auVar33,auVar63);
        auVar28 = vfmadd213ps_fma(auVar66,auVar1,auVar72);
        auVar21 = vroundps_avx(ZEXT1632(auVar28),1);
        auVar33 = vcmpps_avx(ZEXT1632(auVar28),auVar21,1);
        auVar33 = vandps_avx(auVar74,auVar33);
        auVar33 = vsubps_avx(auVar21,auVar33);
        auVar19 = vfmadd231ps_fma(auVar1,auVar33,auVar76);
        auVar20 = ZEXT1632(auVar19);
        fVar2 = auVar19._0_4_;
        fVar3 = auVar19._4_4_;
        fVar4 = auVar19._8_4_;
        fVar5 = auVar19._12_4_;
        auVar1._28_4_ = auVar21._28_4_;
        auVar1._0_28_ =
             ZEXT1628(CONCAT412(fVar5 * fVar5,
                                CONCAT48(fVar4 * fVar4,CONCAT44(fVar3 * fVar3,fVar2 * fVar2))));
        auVar28 = vfmadd213ps_fma(auVar78,auVar20,auVar80);
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar20,auVar82);
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar20,auVar84);
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),ZEXT1632(auVar19),auVar86);
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),ZEXT1632(auVar19),auVar72);
        auVar21._0_4_ = fVar2 + 1.0;
        auVar21._4_4_ = fVar3 + 1.0;
        auVar21._8_4_ = fVar4 + 1.0;
        auVar21._12_4_ = fVar5 + 1.0;
        auVar21._16_4_ = 0x3f800000;
        auVar21._20_4_ = 0x3f800000;
        auVar21._24_4_ = 0x3f800000;
        auVar21._28_4_ = 0x3f800000;
        auVar28 = vfmadd231ps_fma(auVar21,auVar1,ZEXT1632(auVar28));
        auVar20._0_4_ = (int)auVar33._0_4_;
        auVar20._4_4_ = (int)auVar33._4_4_;
        auVar20._8_4_ = (int)auVar33._8_4_;
        auVar20._12_4_ = (int)auVar33._12_4_;
        auVar20._16_4_ = (int)auVar33._16_4_;
        auVar20._20_4_ = (int)auVar33._20_4_;
        auVar20._24_4_ = (int)auVar33._24_4_;
        auVar20._28_4_ = (int)auVar33._28_4_;
        auVar33 = vpslld_avx2(auVar20,0x17);
        auVar33 = vpaddd_avx2(auVar33,auVar38);
        auVar28 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar28),auVar74);
        auVar33 = vrcpps_avx(ZEXT1632(auVar28));
        auVar25 = ZEXT3264(auVar33);
        auVar28 = vfmsub213ps_fma(ZEXT1632(auVar28),auVar33,auVar74);
        auVar28 = vfnmadd132ps_fma(ZEXT1632(auVar28),auVar33,auVar33);
        auVar28 = vfnmsub213ps_fma(ZEXT1632(auVar28),auVar22,auVar74);
        *pauVar9 = ZEXT1632(auVar28);
        pauVar9 = pauVar9 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar12 < 1) {
      iVar12 = _c;
    }
    if (iVar10 < 1) {
      iVar10 = iVar8;
    }
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    for (; _c != iVar10; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar9 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar85._8_4_ = 0x3e2aaaaa;
      auVar85._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar85._12_4_ = 0x3e2aaaaa;
      auVar83._8_4_ = 0x3d2aa9c1;
      auVar83._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar83._12_4_ = 0x3d2aa9c1;
      auVar81._8_4_ = 0x3c088908;
      auVar81._0_8_ = 0x3c0889083c088908;
      auVar81._12_4_ = 0x3c088908;
      auVar79._8_4_ = 0x3ab743ce;
      auVar79._0_8_ = 0x3ab743ce3ab743ce;
      auVar79._12_4_ = 0x3ab743ce;
      auVar77._8_4_ = 0x39506967;
      auVar77._0_8_ = 0x3950696739506967;
      auVar77._12_4_ = 0x39506967;
      auVar75._8_4_ = 0xbf317218;
      auVar75._0_8_ = 0xbf317218bf317218;
      auVar75._12_4_ = 0xbf317218;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar71._8_4_ = 0x3f000000;
      auVar71._0_8_ = 0x3f0000003f000000;
      auVar71._12_4_ = 0x3f000000;
      auVar65._8_4_ = 0x3fb8aa3b;
      auVar65._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar65._12_4_ = 0x3fb8aa3b;
      auVar58._8_4_ = 0xc2b0c0a5;
      auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar58._12_4_ = 0xc2b0c0a5;
      auVar54._8_4_ = 0x42b0c0a5;
      auVar54._0_8_ = 0x42b0c0a542b0c0a5;
      auVar54._12_4_ = 0x42b0c0a5;
      iVar8 = iVar12;
      while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
        auVar15._0_4_ = *(float *)*pauVar9 * -2.0;
        auVar15._4_4_ = *(float *)(*pauVar9 + 4) * -2.0;
        auVar15._8_4_ = *(float *)(*pauVar9 + 8) * -2.0;
        auVar15._12_4_ = *(float *)(*pauVar9 + 0xc) * -2.0;
        auVar28 = vminps_avx(auVar15,auVar54);
        auVar18 = vmaxps_avx(auVar28,auVar58);
        auVar28 = vfmadd213ps_fma(auVar65,auVar18,auVar71);
        auVar39._0_4_ = (int)auVar28._0_4_;
        auVar39._4_4_ = (int)auVar28._4_4_;
        auVar39._8_4_ = (int)auVar28._8_4_;
        auVar39._12_4_ = (int)auVar28._12_4_;
        auVar19 = vcvtdq2ps_avx(auVar39);
        auVar28 = vcmpps_avx(auVar28,auVar19,1);
        auVar28 = vandps_avx(auVar73,auVar28);
        auVar28 = vsubps_avx(auVar19,auVar28);
        auVar18 = vfmadd231ps_fma(auVar18,auVar28,auVar75);
        fVar2 = auVar18._0_4_;
        auVar40._0_4_ = fVar2 * fVar2;
        fVar3 = auVar18._4_4_;
        auVar40._4_4_ = fVar3 * fVar3;
        fVar4 = auVar18._8_4_;
        auVar40._8_4_ = fVar4 * fVar4;
        fVar5 = auVar18._12_4_;
        auVar40._12_4_ = fVar5 * fVar5;
        auVar19 = vfmadd213ps_fma(auVar77,auVar18,auVar79);
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar81);
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar83);
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar85);
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar71);
        auVar16._0_4_ = fVar2 + 1.0;
        auVar16._4_4_ = fVar3 + 1.0;
        auVar16._8_4_ = fVar4 + 1.0;
        auVar16._12_4_ = fVar5 + 1.0;
        auVar19 = vfmadd231ps_fma(auVar16,auVar40,auVar19);
        auVar27._0_4_ = (int)auVar28._0_4_;
        auVar27._4_4_ = (int)auVar28._4_4_;
        auVar27._8_4_ = (int)auVar28._8_4_;
        auVar27._12_4_ = (int)auVar28._12_4_;
        auVar28 = vpslld_avx(auVar27,0x17);
        auVar28 = vpaddd_avx(auVar28,auVar14);
        auVar19 = vfmadd213ps_fma(auVar28,auVar19,auVar73);
        auVar28 = vrcpps_avx(auVar19);
        auVar41._0_4_ = auVar28._0_4_ + auVar28._0_4_;
        auVar41._4_4_ = auVar28._4_4_ + auVar28._4_4_;
        auVar41._8_4_ = auVar28._8_4_ + auVar28._8_4_;
        auVar41._12_4_ = auVar28._12_4_ + auVar28._12_4_;
        auVar48._8_4_ = 0x40000000;
        auVar48._0_8_ = 0x4000000040000000;
        auVar48._12_4_ = 0x40000000;
        auVar19 = vfmsub213ps_fma(auVar19,auVar41,auVar48);
        auVar28 = vfnmadd213ps_fma(auVar19,auVar28,auVar41);
        auVar17._0_4_ = auVar28._0_4_ + -1.0;
        auVar17._4_4_ = auVar28._4_4_ + -1.0;
        auVar17._8_4_ = auVar28._8_4_ + -1.0;
        auVar17._12_4_ = auVar28._12_4_ + -1.0;
        *(undefined1 (*) [16])*pauVar9 = auVar17;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      }
    }
  }
  else {
    if (iVar10 < 1) {
      iVar10 = iVar8;
    }
    auVar33._8_4_ = 0x3f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    auVar33._12_4_ = 0x3f800000;
    auVar33._16_4_ = 0x3f800000;
    auVar33._20_4_ = 0x3f800000;
    auVar33._24_4_ = 0x3f800000;
    auVar33._28_4_ = 0x3f800000;
    auVar25 = ZEXT3264(auVar33);
    for (; _c != iVar10; _c = _c + 1) {
      auVar25 = ZEXT1664(auVar25._0_16_);
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar7 = local_78.data;
      Mat::~Mat(&local_78);
      lVar11 = 0;
      pauVar9 = (undefined1 (*) [32])pvVar7;
      for (iVar8 = 0; iVar8 + 7 < iVar12; iVar8 = iVar8 + 8) {
        auVar53._8_4_ = 0xc0000000;
        auVar53._0_8_ = 0xc0000000c0000000;
        auVar53._12_4_ = 0xc0000000;
        auVar53._16_4_ = 0xc0000000;
        auVar53._20_4_ = 0xc0000000;
        auVar53._24_4_ = 0xc0000000;
        auVar53._28_4_ = 0xc0000000;
        auVar26._0_4_ = *(float *)*pauVar9 * -2.0;
        auVar26._4_4_ = *(float *)(*pauVar9 + 4) * -2.0;
        auVar26._8_4_ = *(float *)(*pauVar9 + 8) * -2.0;
        auVar26._12_4_ = *(float *)(*pauVar9 + 0xc) * -2.0;
        auVar26._16_4_ = *(float *)(*pauVar9 + 0x10) * -2.0;
        auVar26._20_4_ = *(float *)(*pauVar9 + 0x14) * -2.0;
        auVar26._28_36_ = auVar25._28_36_;
        auVar26._24_4_ = *(float *)(*pauVar9 + 0x18) * -2.0;
        auVar34._8_4_ = 0x42b0c0a5;
        auVar34._0_8_ = 0x42b0c0a542b0c0a5;
        auVar34._12_4_ = 0x42b0c0a5;
        auVar34._16_4_ = 0x42b0c0a5;
        auVar34._20_4_ = 0x42b0c0a5;
        auVar34._24_4_ = 0x42b0c0a5;
        auVar34._28_4_ = 0x42b0c0a5;
        auVar38 = vminps_avx(auVar26._0_32_,auVar34);
        auVar35._8_4_ = 0xc2b0c0a5;
        auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar35._12_4_ = 0xc2b0c0a5;
        auVar35._16_4_ = 0xc2b0c0a5;
        auVar35._20_4_ = 0xc2b0c0a5;
        auVar35._24_4_ = 0xc2b0c0a5;
        auVar35._28_4_ = 0xc2b0c0a5;
        auVar22 = vmaxps_avx(auVar38,auVar35);
        auVar36._8_4_ = 0x3fb8aa3b;
        auVar36._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar36._12_4_ = 0x3fb8aa3b;
        auVar36._16_4_ = 0x3fb8aa3b;
        auVar36._20_4_ = 0x3fb8aa3b;
        auVar36._24_4_ = 0x3fb8aa3b;
        auVar36._28_4_ = 0x3fb8aa3b;
        auVar57._8_4_ = 0x3f000000;
        auVar57._0_8_ = 0x3f0000003f000000;
        auVar57._12_4_ = 0x3f000000;
        auVar57._16_4_ = 0x3f000000;
        auVar57._20_4_ = 0x3f000000;
        auVar57._24_4_ = 0x3f000000;
        auVar57._28_4_ = 0x3f000000;
        auVar28 = vfmadd213ps_fma(auVar36,auVar22,auVar57);
        auVar56 = vroundps_avx(ZEXT1632(auVar28),1);
        auVar38 = vcmpps_avx(ZEXT1632(auVar28),auVar56,1);
        auVar64._8_4_ = 0x3f800000;
        auVar64._0_8_ = 0x3f8000003f800000;
        auVar64._12_4_ = 0x3f800000;
        auVar64._16_4_ = 0x3f800000;
        auVar64._20_4_ = 0x3f800000;
        auVar64._24_4_ = 0x3f800000;
        auVar64._28_4_ = 0x3f800000;
        auVar38 = vandps_avx(auVar38,auVar64);
        auVar38 = vsubps_avx(auVar56,auVar38);
        auVar47._8_4_ = 0xbf317218;
        auVar47._0_8_ = 0xbf317218bf317218;
        auVar47._12_4_ = 0xbf317218;
        auVar47._16_4_ = 0xbf317218;
        auVar47._20_4_ = 0xbf317218;
        auVar47._24_4_ = 0xbf317218;
        auVar47._28_4_ = 0xbf317218;
        auVar19 = vfmadd231ps_fma(auVar22,auVar38,auVar47);
        auVar22 = ZEXT1632(auVar19);
        fVar2 = auVar19._0_4_;
        fVar3 = auVar19._4_4_;
        fVar4 = auVar19._8_4_;
        fVar5 = auVar19._12_4_;
        auVar6._28_4_ = 0xbf317218;
        auVar6._0_28_ =
             ZEXT1628(CONCAT412(fVar5 * fVar5,
                                CONCAT48(fVar4 * fVar4,CONCAT44(fVar3 * fVar3,fVar2 * fVar2))));
        auVar51._8_4_ = 0x39506967;
        auVar51._0_8_ = 0x3950696739506967;
        auVar51._12_4_ = 0x39506967;
        auVar51._16_4_ = 0x39506967;
        auVar51._20_4_ = 0x39506967;
        auVar51._24_4_ = 0x39506967;
        auVar51._28_4_ = 0x39506967;
        auVar67._8_4_ = 0x3ab743ce;
        auVar67._0_8_ = 0x3ab743ce3ab743ce;
        auVar67._12_4_ = 0x3ab743ce;
        auVar67._16_4_ = 0x3ab743ce;
        auVar67._20_4_ = 0x3ab743ce;
        auVar67._24_4_ = 0x3ab743ce;
        auVar67._28_4_ = 0x3ab743ce;
        auVar28 = vfmadd213ps_fma(auVar51,auVar22,auVar67);
        auVar68._8_4_ = 0x3c088908;
        auVar68._0_8_ = 0x3c0889083c088908;
        auVar68._12_4_ = 0x3c088908;
        auVar68._16_4_ = 0x3c088908;
        auVar68._20_4_ = 0x3c088908;
        auVar68._24_4_ = 0x3c088908;
        auVar68._28_4_ = 0x3c088908;
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar22,auVar68);
        auVar69._8_4_ = 0x3d2aa9c1;
        auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar69._12_4_ = 0x3d2aa9c1;
        auVar69._16_4_ = 0x3d2aa9c1;
        auVar69._20_4_ = 0x3d2aa9c1;
        auVar69._24_4_ = 0x3d2aa9c1;
        auVar69._28_4_ = 0x3d2aa9c1;
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar22,auVar69);
        auVar70._8_4_ = 0x3e2aaaaa;
        auVar70._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar70._12_4_ = 0x3e2aaaaa;
        auVar70._16_4_ = 0x3e2aaaaa;
        auVar70._20_4_ = 0x3e2aaaaa;
        auVar70._24_4_ = 0x3e2aaaaa;
        auVar70._28_4_ = 0x3e2aaaaa;
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),ZEXT1632(auVar19),auVar70);
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),ZEXT1632(auVar19),auVar57);
        auVar23._0_4_ = fVar2 + 1.0;
        auVar23._4_4_ = fVar3 + 1.0;
        auVar23._8_4_ = fVar4 + 1.0;
        auVar23._12_4_ = fVar5 + 1.0;
        auVar23._16_4_ = 0x3f800000;
        auVar23._20_4_ = 0x3f800000;
        auVar23._24_4_ = 0x3f800000;
        auVar23._28_4_ = 0x3f800000;
        auVar28 = vfmadd231ps_fma(auVar23,auVar6,ZEXT1632(auVar28));
        auVar37._0_4_ = (int)auVar38._0_4_;
        auVar37._4_4_ = (int)auVar38._4_4_;
        auVar37._8_4_ = (int)auVar38._8_4_;
        auVar37._12_4_ = (int)auVar38._12_4_;
        auVar37._16_4_ = (int)auVar38._16_4_;
        auVar37._20_4_ = (int)auVar38._20_4_;
        auVar37._24_4_ = (int)auVar38._24_4_;
        auVar37._28_4_ = (int)auVar38._28_4_;
        auVar38 = vpslld_avx2(auVar37,0x17);
        auVar38 = vpaddd_avx2(auVar38,auVar33);
        auVar28 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar28),auVar64);
        auVar38 = vrcpps_avx(ZEXT1632(auVar28));
        auVar25 = ZEXT3264(auVar38);
        auVar28 = vfmsub213ps_fma(ZEXT1632(auVar28),auVar38,auVar64);
        auVar28 = vfnmadd132ps_fma(ZEXT1632(auVar28),auVar38,auVar38);
        auVar28 = vfnmsub213ps_fma(ZEXT1632(auVar28),auVar53,auVar64);
        *pauVar9 = ZEXT1632(auVar28);
        pauVar9 = pauVar9 + 1;
        lVar11 = lVar11 + 8;
      }
      for (; iVar8 + 3 < iVar12; iVar8 = iVar8 + 4) {
        auVar28._0_4_ = *(float *)*pauVar9 * -2.0;
        auVar28._4_4_ = *(float *)(*pauVar9 + 4) * -2.0;
        auVar28._8_4_ = *(float *)(*pauVar9 + 8) * -2.0;
        auVar28._12_4_ = *(float *)(*pauVar9 + 0xc) * -2.0;
        auVar29._8_4_ = 0x42b0c0a5;
        auVar29._0_8_ = 0x42b0c0a542b0c0a5;
        auVar29._12_4_ = 0x42b0c0a5;
        auVar28 = vminps_avx(auVar28,auVar29);
        auVar30._8_4_ = 0xc2b0c0a5;
        auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30._12_4_ = 0xc2b0c0a5;
        auVar18 = vmaxps_avx(auVar28,auVar30);
        auVar31._8_4_ = 0x3fb8aa3b;
        auVar31._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar31._12_4_ = 0x3fb8aa3b;
        auVar52._8_4_ = 0x3f000000;
        auVar52._0_8_ = 0x3f0000003f000000;
        auVar52._12_4_ = 0x3f000000;
        auVar28 = vfmadd213ps_fma(auVar31,auVar18,auVar52);
        auVar42._0_4_ = (int)auVar28._0_4_;
        auVar42._4_4_ = (int)auVar28._4_4_;
        auVar42._8_4_ = (int)auVar28._8_4_;
        auVar42._12_4_ = (int)auVar28._12_4_;
        auVar19 = vcvtdq2ps_avx(auVar42);
        auVar28 = vcmpps_avx(auVar28,auVar19,1);
        auVar55._8_4_ = 0x3f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar55._12_4_ = 0x3f800000;
        auVar28 = vandps_avx(auVar28,auVar55);
        auVar28 = vsubps_avx(auVar19,auVar28);
        auVar43._8_4_ = 0xbf317218;
        auVar43._0_8_ = 0xbf317218bf317218;
        auVar43._12_4_ = 0xbf317218;
        auVar18 = vfmadd231ps_fma(auVar18,auVar28,auVar43);
        fVar2 = auVar18._0_4_;
        auVar44._0_4_ = fVar2 * fVar2;
        fVar3 = auVar18._4_4_;
        auVar44._4_4_ = fVar3 * fVar3;
        fVar4 = auVar18._8_4_;
        auVar44._8_4_ = fVar4 * fVar4;
        fVar5 = auVar18._12_4_;
        auVar44._12_4_ = fVar5 * fVar5;
        auVar49._8_4_ = 0x39506967;
        auVar49._0_8_ = 0x3950696739506967;
        auVar49._12_4_ = 0x39506967;
        auVar59._8_4_ = 0x3ab743ce;
        auVar59._0_8_ = 0x3ab743ce3ab743ce;
        auVar59._12_4_ = 0x3ab743ce;
        auVar19 = vfmadd213ps_fma(auVar49,auVar18,auVar59);
        auVar60._8_4_ = 0x3c088908;
        auVar60._0_8_ = 0x3c0889083c088908;
        auVar60._12_4_ = 0x3c088908;
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar60);
        auVar61._8_4_ = 0x3d2aa9c1;
        auVar61._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar61._12_4_ = 0x3d2aa9c1;
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar61);
        auVar62._8_4_ = 0x3e2aaaaa;
        auVar62._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar62._12_4_ = 0x3e2aaaaa;
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar62);
        auVar19 = vfmadd213ps_fma(auVar19,auVar18,auVar52);
        auVar18._0_4_ = fVar2 + 1.0;
        auVar18._4_4_ = fVar3 + 1.0;
        auVar18._8_4_ = fVar4 + 1.0;
        auVar18._12_4_ = fVar5 + 1.0;
        auVar19 = vfmadd231ps_fma(auVar18,auVar44,auVar19);
        auVar32._0_4_ = (int)auVar28._0_4_;
        auVar32._4_4_ = (int)auVar28._4_4_;
        auVar32._8_4_ = (int)auVar28._8_4_;
        auVar32._12_4_ = (int)auVar28._12_4_;
        auVar45._8_4_ = 0x3f800000;
        auVar45._0_8_ = 0x3f8000003f800000;
        auVar45._12_4_ = 0x3f800000;
        auVar28 = vpslld_avx(auVar32,0x17);
        auVar28 = vpaddd_avx(auVar28,auVar45);
        auVar19 = vfmadd213ps_fma(auVar28,auVar19,auVar55);
        auVar28 = vrcpps_avx(auVar19);
        auVar46._0_4_ = auVar28._0_4_ + auVar28._0_4_;
        auVar46._4_4_ = auVar28._4_4_ + auVar28._4_4_;
        auVar46._8_4_ = auVar28._8_4_ + auVar28._8_4_;
        auVar46._12_4_ = auVar28._12_4_ + auVar28._12_4_;
        auVar50._8_4_ = 0x40000000;
        auVar50._0_8_ = 0x4000000040000000;
        auVar50._12_4_ = 0x40000000;
        auVar19 = vfmsub213ps_fma(auVar19,auVar46,auVar50);
        auVar28 = vfnmadd213ps_fma(auVar19,auVar28,auVar46);
        auVar19._0_4_ = auVar28._0_4_ + -1.0;
        auVar19._4_4_ = auVar28._4_4_ + -1.0;
        auVar19._8_4_ = auVar28._8_4_ + -1.0;
        auVar19._12_4_ = auVar28._12_4_ + -1.0;
        auVar25 = ZEXT1664(auVar19);
        *(undefined1 (*) [16])*pauVar9 = auVar19;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
        lVar11 = lVar11 + 4;
      }
      for (; (int)lVar11 < iVar12; lVar11 = lVar11 + 1) {
        auVar25._0_4_ = tanhf(*(float *)((undefined1 *)pvVar7 + lVar11 * 4));
        auVar25._4_60_ = extraout_var;
        *(float *)((undefined1 *)pvVar7 + lVar11 * 4) = auVar25._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}